

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O1

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isIllegalVertexOutput
               (VarType *varType,bool insideAStruct,bool insideAnArray)

{
  Type TVar1;
  DataType DVar2;
  pointer pSVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  VarType *varType_00;
  uint uVar7;
  
  for (; TVar1 = varType->m_type, TVar1 == TYPE_ARRAY; varType = (varType->m_data).array.elementType
      ) {
    if (((insideAStruct | insideAnArray) & 1U) != 0) {
      return true;
    }
    insideAnArray = true;
    insideAStruct = false;
  }
  if (TVar1 != TYPE_BASIC) {
    if (((insideAStruct | insideAnArray) & 1U) != 0 || TVar1 != TYPE_STRUCT) {
      return true;
    }
    pSVar3 = (((varType->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (int)((long)(((varType->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x49249249
    ;
    if ((int)uVar7 < 1) {
      return 0 < (int)uVar7;
    }
    bVar5 = isIllegalVertexOutput(&pSVar3->m_type,true,false);
    if (bVar5) {
      return 0 < (int)uVar7;
    }
    varType_00 = &pSVar3[1].m_type;
    uVar4 = 1;
    do {
      uVar6 = uVar4;
      if ((uVar7 & 0x7fffffff) == uVar6) break;
      bVar5 = isIllegalVertexOutput(varType_00,true,false);
      varType_00 = (VarType *)&varType_00[2].m_data;
      uVar4 = uVar6 + 1;
    } while (!bVar5);
    return uVar6 < (uVar7 & 0x7fffffff);
  }
  DVar2 = (varType->m_data).basic.type;
  if (DVar2 - TYPE_FLOAT < 0x23) {
    if ((2 < DVar2 - TYPE_BOOL_VEC2 &
        ((byte)(0x7fc01e00f >> ((byte)(DVar2 - TYPE_FLOAT) & 0x3f)) ^ 1)) == 0) {
LAB_016c5db2:
      bVar5 = false;
      goto LAB_016c5e75;
    }
  }
  else if (DVar2 - TYPE_BOOL_VEC2 < 3) goto LAB_016c5db2;
  bVar5 = DVar2 - TYPE_INT < 0xfffffff7 && DVar2 - TYPE_DOUBLE < 0xfffffff7;
LAB_016c5e75:
  return (bool)(DVar2 - TYPE_BOOL < 4 | bVar5);
}

Assistant:

static bool isIllegalVertexOutput (const glu::VarType& varType, bool insideAStruct = false, bool insideAnArray = false)
{
	// booleans, opaque types, arrays of arrays, arrays of structs, array in struct, struct struct are not allowed as vertex outputs

	if (varType.isBasicType())
	{
		const bool isOpaqueType = !glu::isDataTypeScalar(varType.getBasicType()) && !glu::isDataTypeVector(varType.getBasicType()) && !glu::isDataTypeMatrix(varType.getBasicType());

		if (glu::isDataTypeBoolOrBVec(varType.getBasicType()))
			return true;

		if (isOpaqueType)
			return true;

		return false;
	}
	else if (varType.isArrayType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		return isIllegalVertexOutput(varType.getElementType(), insideAStruct, true);
	}
	else if (varType.isStructType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isIllegalVertexOutput(varType.getStructPtr()->getMember(ndx).getType(), true, insideAnArray))
				return true;

		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}